

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser.cpp
# Opt level: O1

ptr<Expression> __thiscall Parser::castable(Parser *this)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var1;
  _Alloc_hider _Var2;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var3;
  bool bVar4;
  undefined8 extraout_RAX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_01;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_02;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_03;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var5;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_04;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_05;
  Parser *in_RSI;
  ptr<Expression> pVar6;
  undefined1 local_29;
  _Alloc_hider local_28;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_20;
  Type local_14;
  
  unary(this);
  bVar4 = match(in_RSI,As);
  _Var5._M_pi = extraout_RDX;
  if (bVar4) {
    consume(in_RSI);
    bVar4 = match(in_RSI,StringType);
    if (bVar4) {
      consume(in_RSI);
      local_14 = String;
      local_28._M_p = (pointer)0x0;
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
      __shared_count<Cast,std::allocator<Cast>,std::shared_ptr<Expression>&,Type&>
                (&_Stack_20,(Cast **)&local_28,(allocator<Cast> *)&local_29,
                 (shared_ptr<Expression> *)this,&local_14);
      _Var5._M_pi = extraout_RDX_00;
    }
    else {
      bVar4 = match(in_RSI,DoubleType);
      if (bVar4) {
        consume(in_RSI);
        local_14 = Double;
        local_28._M_p = (pointer)0x0;
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
        __shared_count<Cast,std::allocator<Cast>,std::shared_ptr<Expression>&,Type&>
                  (&_Stack_20,(Cast **)&local_28,(allocator<Cast> *)&local_29,
                   (shared_ptr<Expression> *)this,&local_14);
        _Var5._M_pi = extraout_RDX_01;
      }
      else {
        bVar4 = match(in_RSI,IntegerType);
        if (bVar4) {
          consume(in_RSI);
          local_14 = Integer;
          local_28._M_p = (pointer)0x0;
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
          __shared_count<Cast,std::allocator<Cast>,std::shared_ptr<Expression>&,Type&>
                    (&_Stack_20,(Cast **)&local_28,(allocator<Cast> *)&local_29,
                     (shared_ptr<Expression> *)this,&local_14);
          _Var5._M_pi = extraout_RDX_02;
        }
        else {
          bVar4 = match(in_RSI,BooleanType);
          if (!bVar4) {
            unexpected(in_RSI);
            p_Var1 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                     (this->filepath)._M_string_length;
            if (p_Var1 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var1);
            }
            _Unwind_Resume(extraout_RAX);
          }
          consume(in_RSI);
          local_14 = Boolean;
          local_28._M_p = (pointer)0x0;
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
          __shared_count<Cast,std::allocator<Cast>,std::shared_ptr<Expression>&,Type&>
                    (&_Stack_20,(Cast **)&local_28,(allocator<Cast> *)&local_29,
                     (shared_ptr<Expression> *)this,&local_14);
          _Var5._M_pi = extraout_RDX_03;
        }
      }
    }
    _Var3._M_pi = _Stack_20._M_pi;
    _Var2._M_p = local_28._M_p;
    local_28._M_p = (pointer)0x0;
    _Stack_20._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    p_Var1 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(this->filepath)._M_string_length;
    (this->filepath)._M_dataplus._M_p = _Var2._M_p;
    (this->filepath)._M_string_length = (size_type)_Var3._M_pi;
    if (p_Var1 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var1);
      _Var5._M_pi = extraout_RDX_04;
    }
    if (_Stack_20._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Stack_20._M_pi);
      _Var5._M_pi = extraout_RDX_05;
    }
  }
  pVar6.super___shared_ptr<Expression,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi = _Var5._M_pi;
  pVar6.super___shared_ptr<Expression,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)this;
  return (ptr<Expression>)pVar6.super___shared_ptr<Expression,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

ptr<Expression> Parser::castable() {
    ptr<Expression> expr = unary();

    if(match(TokenType::As)) {
        consume();

        if(match(TokenType::StringType)) {
            consume();
            expr = make<Cast>(expr, Type::String);
        } else if(match(TokenType::DoubleType)) {
            consume();
            expr = make<Cast>(expr, Type::Double);
        } else if(match(TokenType::IntegerType)) {
            consume();
            expr = make<Cast>(expr, Type::Integer);
        } else if(match(TokenType::BooleanType)) {
            consume();
            expr = make<Cast>(expr, Type::Boolean);
        } else {
            unexpected();
        }
    }

    return expr;
}